

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

void __thiscall imrt::Volume::set_data(Volume *this,string *file)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  runtime_error *this_00;
  istream *piVar5;
  size_type sVar6;
  char *__nptr;
  mapped_type *this_01;
  string *in_RSI;
  undefined8 *in_RDI;
  int count;
  int j;
  int a;
  int i;
  int angle;
  const_iterator __end1;
  const_iterator __begin1;
  list<int,_std::allocator<int>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  iterator it;
  double aux2;
  double aux1;
  stringstream ss;
  ifstream myfile;
  string linec;
  string line;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  Collimator *in_stack_fffffffffffffb00;
  value_type *in_stack_fffffffffffffb08;
  Matrix *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  int iVar7;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  *in_stack_fffffffffffffb40;
  int local_45c;
  int local_454;
  _Self local_438;
  _Self local_430;
  list<int,_std::allocator<int>_> *local_428;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_420;
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  local_408 [3];
  long local_3f0 [51];
  istream local_258 [520];
  string local_50 [32];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::ifstream::ifstream(local_258,in_RSI,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)local_3f0);
  __gnu_cxx::
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  ::__normal_iterator(local_408);
  *(undefined4 *)(in_RDI + 7) = 0xffffffff;
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"error reading file.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x15be3b);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_258,local_30);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_258,local_30);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  }
  std::ifstream::close();
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_420);
  *(int *)(in_RDI + 7) = (int)sVar6 + -1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_420,0);
  std::__cxx11::stringstream::str((string *)local_3f0);
  local_428 = Collimator::getAngles_abi_cxx11_((Collimator *)*in_RDI);
  local_430._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin
                 ((list<int,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  local_438._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::end
                 ((list<int,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  while( true ) {
    bVar2 = std::operator!=(&local_430,&local_438);
    if (!bVar2) break;
    std::_List_const_iterator<int>::operator*
              ((_List_const_iterator<int> *)in_stack_fffffffffffffb00);
    Collimator::getNangleBeamlets(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
    maths::Matrix::Matrix
              (in_stack_fffffffffffffb10,(int)((ulong)in_stack_fffffffffffffb08 >> 0x20),
               (int)in_stack_fffffffffffffb08);
    std::
    map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>::
    operator[](in_stack_fffffffffffffb40,
               (key_type_conflict *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    maths::Matrix::operator=
              ((Matrix *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (Matrix *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    maths::Matrix::~Matrix(in_stack_fffffffffffffb10);
    std::_List_const_iterator<int>::operator++(&local_430);
  }
  for (local_454 = 0; local_454 < *(int *)(in_RDI + 7); local_454 = local_454 + 1) {
    std::ios::clear((long)local_3f0 + *(long *)(local_3f0[0] + -0x18),0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_420,(long)local_454);
    std::__cxx11::stringstream::str((string *)local_3f0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_3f0,local_30,'\t');
    local_45c = 0;
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3f0,local_30,'\t');
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      in_stack_fffffffffffffb3c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb3c);
      if (!bVar2) break;
      iVar7 = local_45c;
      iVar3 = Collimator::getAngle(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
      iVar4 = Collimator::getNangleBeamlets(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
      if (iVar4 <= iVar7) {
        local_45c = 0;
      }
      __nptr = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffb10 = (Matrix *)atof(__nptr);
      Collimator::getAngle(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
      this_01 = std::
                map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                              *)piVar5,
                             (key_type_conflict *)CONCAT44(in_stack_fffffffffffffb3c,iVar3));
      in_stack_fffffffffffffb00 =
           (Collimator *)maths::Matrix::operator()(this_01,local_454,local_45c);
      *(Matrix **)&(in_stack_fffffffffffffb00->beam_coord)._M_t._M_impl = in_stack_fffffffffffffb10;
      local_45c = local_45c + 1;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb10);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3f0);
  std::ifstream::~ifstream(local_258);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Volume::set_data(string file) {
  string line, linec;
  ifstream myfile (file);
  stringstream ss;
  double aux1, aux2;
  vector <pair<double,double> >::iterator it;

  //nb_beamlets=-1;
  nb_voxels=-1;

  if (!myfile.is_open())
    throw runtime_error("error reading file.");

  // Get dimensions of the matrix voxels/beamlets matrix
  vector<string> lines;
  // First line not considered
  // TODO: read name of the volume!
  getline (myfile,line);
  // Initial reading
  while (getline (myfile,line) )
    lines.push_back(line);
  myfile.close();
  nb_voxels = lines.size()-1;
  ss.str(lines[0]);

  for(auto angle:collimator.getAngles())
    D[angle]=Matrix(nb_voxels, collimator.getNangleBeamlets(angle));

  for (int i=0; i<nb_voxels; i++) {
    ss.clear(); ss.str(lines[i]);
    getline(ss, line, '\t');
    int a=0, j=0;
    int count=0;
    while (getline(ss, line, '\t') ) {
      if (j >= collimator.getNangleBeamlets( collimator.getAngle(a) )) {
        a++; j=0;
      }
      D[ collimator.getAngle(a) ](i,j)=atof(line.c_str());
      j++;
    }
  }

}